

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line_table_reader_common.h
# Opt level: O0

void IssueExpError(Dwarf_Debug dbg,Dwarf_Error *err,char *msg,Dwarf_Unsigned val)

{
  char *msg_00;
  char local_118 [8];
  char buf [200];
  undefined1 local_48 [8];
  dwarfstring m;
  Dwarf_Unsigned val_local;
  char *msg_local;
  Dwarf_Error *err_local;
  Dwarf_Debug dbg_local;
  
  m._24_8_ = val;
  dwarfstring_constructor_static((dwarfstring_s *)local_48,local_118,200);
  dwarfstring_append((dwarfstring_s *)local_48,"ERROR: ");
  dwarfstring_append((dwarfstring_s *)local_48,msg);
  dwarfstring_append_printf_u((dwarfstring *)local_48," Bad value: 0x%x",m._24_8_);
  msg_00 = dwarfstring_string((dwarfstring_s *)local_48);
  _dwarf_error_string(dbg,err,0x165,msg_00);
  dwarfstring_destructor((dwarfstring_s *)local_48);
  return;
}

Assistant:

static void
IssueExpError(Dwarf_Debug dbg,
    Dwarf_Error *err,
    const char * msg,
    Dwarf_Unsigned val)
{
    dwarfstring m;
    char buf[200];

    dwarfstring_constructor_static(&m, buf,sizeof(buf));
    dwarfstring_append(&m , "ERROR: ");
    dwarfstring_append(&m ,(char *)msg);
    dwarfstring_append_printf_u(&m , " Bad value: 0x%x", val);
    _dwarf_error_string(dbg, err, DW_DLE_LINE_TABLE_BAD,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}